

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count,N_Vector y,SUNContext sunctx)

{
  SUNNonlinearSolver p_Var1;
  N_Vector in_RDX;
  N_Vector w;
  SUNNonlinearSolver NLS;
  SUNContext in_stack_ffffffffffffffe0;
  
  N_VNew_SensWrapper((int)((ulong)in_RDX >> 0x20),(N_Vector)in_stack_ffffffffffffffe0);
  p_Var1 = SUNNonlinSol_Newton(in_RDX,in_stack_ffffffffffffffe0);
  N_VDestroy((N_Vector)0x1179150);
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count, N_Vector y,
                                           SUNContext sunctx)
{
  SUNNonlinearSolver NLS;
  N_Vector w;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_Newton(w, sunctx);

  /* free sensitivity vector wrapper */
  N_VDestroy(w);

  /* return NLS object */
  return(NLS);
}